

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O2

void err_msg<short>(string *msg,short t,bool expected)

{
  ostream *poVar1;
  string local_40;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)msg);
  to_hex<short>(&local_40,t);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,", expected = ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void err_msg(const std::string& msg, T t, bool expected)
{
	std::cerr << msg << to_hex(t) << ", expected = " << expected << std::endl;
}